

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O0

void __thiscall Interpreter::less_equal(Interpreter *this)

{
  float local_18;
  float local_14;
  float f2;
  float f1;
  Interpreter *this_local;
  
  _f2 = this;
  stackMov(this,&local_14);
  this->stackPos = this->stackPos - 4;
  stackMov(this,&local_18);
  this->stackPos = this->stackPos - 4;
  stackPush(this,(float)(-(uint)(local_18 <= local_14) & 0x3f800000));
  return;
}

Assistant:

void Interpreter::less_equal() {
    float f1, f2;
    stackMov(&f1);
    stackPos -= 4;
    stackMov(&f2);
    stackPos -= 4;
    stackPush(f2 <= f1);
}